

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

void __thiscall argh::parser::add_params(parser *this,initializer_list<const_char_*const> init_list)

{
  long lVar1;
  long lVar2;
  allocator local_71;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (init_list._M_len != 0) {
    lVar2 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_70,*(char **)((long)init_list._M_array + lVar2),&local_71);
      lVar1 = std::__cxx11::string::find_first_not_of((char)(string *)&local_70,0x2d);
      if (lVar1 == -1) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->registeredParams_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      lVar2 = lVar2 + 8;
    } while (init_list._M_len << 3 != lVar2);
  }
  return;
}

Assistant:

inline void parser::add_params(std::initializer_list<char const* const> init_list)
   {
      for (auto& name : init_list)
         registeredParams_.insert(trim_leading_dashes(name));
   }